

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommands
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs,
          cmGeneratorTarget *target,string *relative)

{
  pointer pcVar1;
  pointer cc;
  string local_f8;
  cmCustomCommandGenerator ccg;
  
  pcVar1 = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
            super__Vector_impl_data._M_start; cc != pcVar1; cc = cc + 1) {
    std::__cxx11::string::string
              ((string *)&local_f8,(string *)&(this->super_cmLocalCommonGenerator).ConfigName);
    cmCustomCommandGenerator::cmCustomCommandGenerator(&ccg,cc,&local_f8,(cmLocalGenerator *)this);
    std::__cxx11::string::~string((string *)&local_f8);
    AppendCustomCommand(this,commands,&ccg,target,relative,true,(ostream *)0x0);
    cmCustomCommandGenerator::~cmCustomCommandGenerator(&ccg);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommands(
  std::vector<std::string>& commands, const std::vector<cmCustomCommand>& ccs,
  cmGeneratorTarget* target, std::string const& relative)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this);
    this->AppendCustomCommand(commands, ccg, target, relative, true);
  }
}